

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O1

shared_ptr<_IO_FILE> __thiscall
phosg::fopen_shared(phosg *this,string *filename,string *mode,FILE *dash_file)

{
  int iVar1;
  FILE *pFVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<_IO_FILE> sVar5;
  
  if (dash_file != (FILE *)0x0) {
    iVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename,
                    "-");
    if (iVar1 == 0) {
      *(FILE **)this = dash_file;
      *(undefined8 *)(this + 8) = 0;
      puVar3 = (undefined8 *)operator_new(0x18);
      puVar3[1] = 0x100000001;
      *puVar3 = &PTR___Sp_counted_base_00138bb8;
      puVar3[2] = dash_file;
      *(undefined8 **)(this + 8) = puVar3;
      _Var4._M_pi = extraout_RDX_00;
      goto LAB_00118f20;
    }
  }
  pFVar2 = fopen_binary_raw(filename,mode);
  *(FILE **)this = pFVar2;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<_IO_FILE*,void(*)(_IO_FILE*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),pFVar2,fclose_raw);
  _Var4._M_pi = extraout_RDX;
LAB_00118f20:
  sVar5.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<_IO_FILE>)sVar5.super___shared_ptr<_IO_FILE,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<FILE> fopen_shared(const string& filename, const string& mode, FILE* dash_file) {
  if (dash_file && (filename == "-")) {
    return shared_ptr<FILE>(dash_file, [](FILE*) {});
  }
  return shared_ptr<FILE>(fopen_binary_raw(filename, mode), fclose_raw);
}